

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_heap_gather.cpp
# Opt level: O2

void duckdb::RowOperations::HeapGather
               (Vector *v,idx_t *vcount,SelectionVector *sel,data_ptr_t *key_locations,
               optional_ptr<duckdb::NestedValidity,_true> parent_validity)

{
  PhysicalType PVar1;
  idx_t iVar2;
  data_ptr_t pdVar3;
  pointer ppVar4;
  pointer ppVar5;
  undefined8 uVar6;
  bool bVar7;
  NestedValidity *this;
  child_list_t<LogicalType> *pcVar8;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *this_00;
  reference this_01;
  type v_00;
  NotImplementedException *this_02;
  data_ptr_t pdVar9;
  idx_t iVar10;
  uint *__src;
  idx_t i;
  ulong uVar11;
  ulong row_idx;
  idx_t iVar12;
  idx_t i_4;
  string_t sVar13;
  optional_ptr<duckdb::NestedValidity,_true> parent_validity_local;
  idx_t local_4068;
  NestedValidity parent_validity_1;
  data_ptr_t struct_validitymask_locations [2048];
  
  parent_validity_local = parent_validity;
  Vector::SetVectorType(v,FLAT_VECTOR);
  FlatVector::VerifyFlatVector(v);
  if (parent_validity.ptr != (NestedValidity *)0x0) {
    for (uVar11 = 0; uVar11 < *vcount; uVar11 = uVar11 + 1) {
      this = optional_ptr<duckdb::NestedValidity,_true>::operator->(&parent_validity_local);
      bVar7 = NestedValidity::IsValid(this,uVar11);
      row_idx = uVar11;
      if (sel->sel_vector != (sel_t *)0x0) {
        row_idx = (ulong)sel->sel_vector[uVar11];
      }
      TemplatedValidityMask<unsigned_long>::Set
                (&(v->validity).super_TemplatedValidityMask<unsigned_long>,row_idx,bVar7);
    }
  }
  PVar1 = (v->type).physical_type_;
  pdVar9 = (data_ptr_t)(ulong)(PVar1 - 1);
  switch(pdVar9) {
  case (data_ptr_t)0x0:
  case (data_ptr_t)0x2:
    iVar2 = *vcount;
    pdVar9 = v->data;
    for (iVar10 = 0; iVar2 != iVar10; iVar10 = iVar10 + 1) {
      iVar12 = iVar10;
      if (sel->sel_vector != (sel_t *)0x0) {
        iVar12 = (idx_t)sel->sel_vector[iVar10];
      }
      pdVar9[iVar12] = *key_locations[iVar10];
      key_locations[iVar10] = key_locations[iVar10] + 1;
    }
    break;
  case (data_ptr_t)0x1:
    iVar2 = *vcount;
    pdVar9 = v->data;
    for (iVar10 = 0; iVar2 != iVar10; iVar10 = iVar10 + 1) {
      iVar12 = iVar10;
      if (sel->sel_vector != (sel_t *)0x0) {
        iVar12 = (idx_t)sel->sel_vector[iVar10];
      }
      pdVar9[iVar12] = *key_locations[iVar10];
      key_locations[iVar10] = key_locations[iVar10] + 1;
    }
    break;
  case (data_ptr_t)0x3:
    iVar2 = *vcount;
    pdVar9 = v->data;
    for (iVar10 = 0; iVar2 != iVar10; iVar10 = iVar10 + 1) {
      iVar12 = iVar10;
      if (sel->sel_vector != (sel_t *)0x0) {
        iVar12 = (idx_t)sel->sel_vector[iVar10];
      }
      pdVar3 = key_locations[iVar10];
      *(undefined2 *)(pdVar9 + iVar12 * 2) = *(undefined2 *)pdVar3;
      key_locations[iVar10] = pdVar3 + 2;
    }
    break;
  case (data_ptr_t)0x4:
    iVar2 = *vcount;
    pdVar9 = v->data;
    for (iVar10 = 0; iVar2 != iVar10; iVar10 = iVar10 + 1) {
      iVar12 = iVar10;
      if (sel->sel_vector != (sel_t *)0x0) {
        iVar12 = (idx_t)sel->sel_vector[iVar10];
      }
      pdVar3 = key_locations[iVar10];
      *(undefined2 *)(pdVar9 + iVar12 * 2) = *(undefined2 *)pdVar3;
      key_locations[iVar10] = pdVar3 + 2;
    }
    break;
  case (data_ptr_t)0x5:
    iVar2 = *vcount;
    pdVar9 = v->data;
    for (iVar10 = 0; iVar2 != iVar10; iVar10 = iVar10 + 1) {
      iVar12 = iVar10;
      if (sel->sel_vector != (sel_t *)0x0) {
        iVar12 = (idx_t)sel->sel_vector[iVar10];
      }
      pdVar3 = key_locations[iVar10];
      *(undefined4 *)(pdVar9 + iVar12 * 4) = *(undefined4 *)pdVar3;
      key_locations[iVar10] = pdVar3 + 4;
    }
    break;
  case (data_ptr_t)0x6:
    iVar2 = *vcount;
    pdVar9 = v->data;
    for (iVar10 = 0; iVar2 != iVar10; iVar10 = iVar10 + 1) {
      iVar12 = iVar10;
      if (sel->sel_vector != (sel_t *)0x0) {
        iVar12 = (idx_t)sel->sel_vector[iVar10];
      }
      pdVar3 = key_locations[iVar10];
      *(undefined4 *)(pdVar9 + iVar12 * 4) = *(undefined4 *)pdVar3;
      key_locations[iVar10] = pdVar3 + 4;
    }
    break;
  case (data_ptr_t)0x7:
    iVar2 = *vcount;
    pdVar9 = v->data;
    for (iVar10 = 0; iVar2 != iVar10; iVar10 = iVar10 + 1) {
      iVar12 = iVar10;
      if (sel->sel_vector != (sel_t *)0x0) {
        iVar12 = (idx_t)sel->sel_vector[iVar10];
      }
      pdVar3 = key_locations[iVar10];
      *(undefined8 *)(pdVar9 + iVar12 * 8) = *(undefined8 *)pdVar3;
      key_locations[iVar10] = pdVar3 + 8;
    }
    break;
  case (data_ptr_t)0x8:
    iVar2 = *vcount;
    pdVar9 = v->data;
    for (iVar10 = 0; iVar2 != iVar10; iVar10 = iVar10 + 1) {
      iVar12 = iVar10;
      if (sel->sel_vector != (sel_t *)0x0) {
        iVar12 = (idx_t)sel->sel_vector[iVar10];
      }
      pdVar3 = key_locations[iVar10];
      *(undefined8 *)(pdVar9 + iVar12 * 8) = *(undefined8 *)pdVar3;
      key_locations[iVar10] = pdVar3 + 8;
    }
    break;
  case (data_ptr_t)0x9:
  case (data_ptr_t)0xc:
  case (data_ptr_t)0xd:
  case (data_ptr_t)0xe:
  case (data_ptr_t)0xf:
  case (data_ptr_t)0x10:
  case (data_ptr_t)0x11:
  case (data_ptr_t)0x12:
  case (data_ptr_t)0x13:
  case (data_ptr_t)0x15:
  case (data_ptr_t)0x18:
  case (data_ptr_t)0x19:
  case (data_ptr_t)0x1a:
  case (data_ptr_t)0x1b:
switchD_0167eef5_caseD_a:
    this_02 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)struct_validitymask_locations,"Unimplemented deserialize from row-format",
               (allocator *)&parent_validity_1);
    NotImplementedException::NotImplementedException
              (this_02,(string *)struct_validitymask_locations);
    __cxa_throw(this_02,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case (data_ptr_t)0xa:
    iVar2 = *vcount;
    pdVar9 = v->data;
    for (iVar10 = 0; iVar2 != iVar10; iVar10 = iVar10 + 1) {
      iVar12 = iVar10;
      if (sel->sel_vector != (sel_t *)0x0) {
        iVar12 = (idx_t)sel->sel_vector[iVar10];
      }
      pdVar3 = key_locations[iVar10];
      *(undefined4 *)(pdVar9 + iVar12 * 4) = *(undefined4 *)pdVar3;
      key_locations[iVar10] = pdVar3 + 4;
    }
    break;
  case (data_ptr_t)0xb:
    iVar2 = *vcount;
    pdVar9 = v->data;
    for (iVar10 = 0; iVar2 != iVar10; iVar10 = iVar10 + 1) {
      iVar12 = iVar10;
      if (sel->sel_vector != (sel_t *)0x0) {
        iVar12 = (idx_t)sel->sel_vector[iVar10];
      }
      pdVar3 = key_locations[iVar10];
      *(undefined8 *)(pdVar9 + iVar12 * 8) = *(undefined8 *)pdVar3;
      key_locations[iVar10] = pdVar3 + 8;
    }
    break;
  case (data_ptr_t)0x14:
    iVar2 = *vcount;
    pdVar9 = v->data;
    for (iVar10 = 0; iVar2 != iVar10; iVar10 = iVar10 + 1) {
      iVar12 = iVar10;
      if (sel->sel_vector != (sel_t *)0x0) {
        iVar12 = (idx_t)sel->sel_vector[iVar10];
      }
      uVar6 = *(undefined8 *)(key_locations[iVar10] + 8);
      *(undefined8 *)(pdVar9 + iVar12 * 0x10) = *(undefined8 *)key_locations[iVar10];
      *(undefined8 *)(pdVar9 + iVar12 * 0x10 + 8) = uVar6;
      key_locations[iVar10] = key_locations[iVar10] + 0x10;
    }
    break;
  case (data_ptr_t)0x16:
    HeapGatherListVector(v,*vcount,sel,key_locations);
    break;
  case (data_ptr_t)0x17:
    iVar2 = *vcount;
    local_4068 = iVar2;
    pcVar8 = StructType::GetChildTypes_abi_cxx11_(&v->type);
    ppVar4 = (pcVar8->
             super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             ).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    ppVar5 = (pcVar8->
             super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             ).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (iVar10 = 0; iVar2 != iVar10; iVar10 = iVar10 + 1) {
      pdVar9 = key_locations[iVar10];
      struct_validitymask_locations[iVar10] = pdVar9;
      key_locations[iVar10] = pdVar9 + (((long)ppVar4 - (long)ppVar5) / 0x38 + 7U >> 3);
    }
    this_00 = StructVector::GetEntries(v);
    for (uVar11 = 0;
        uVar11 < (ulong)(((long)(pcVar8->
                                super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                ).
                                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pcVar8->
                               super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                               ).
                               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x38);
        uVar11 = uVar11 + 1) {
      NestedValidity::NestedValidity(&parent_validity_1,struct_validitymask_locations,uVar11);
      this_01 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                ::get<true>(this_00,uVar11);
      v_00 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                       (this_01);
      HeapGather(v_00,&local_4068,sel,key_locations,&parent_validity_1);
    }
    break;
  case (data_ptr_t)0x1c:
    HeapGatherArrayVector(v,*vcount,sel,key_locations);
    break;
  default:
    if (PVar1 == VARCHAR) {
      iVar2 = *vcount;
      FlatVector::VerifyFlatVector(v);
      pdVar3 = v->data;
      for (iVar10 = 0; iVar2 != iVar10; iVar10 = iVar10 + 1) {
        iVar12 = iVar10;
        if (sel->sel_vector != (sel_t *)0x0) {
          iVar12 = (idx_t)sel->sel_vector[iVar10];
        }
        bVar7 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&(v->validity).super_TemplatedValidityMask<unsigned_long>,iVar12);
        if (bVar7) {
          struct_validitymask_locations[0]._0_4_ = *(uint *)key_locations[iVar10];
          uVar11 = (ulong)(uint)struct_validitymask_locations[0];
          __src = (uint *)((long)key_locations[iVar10] + 4);
          key_locations[iVar10] = (data_ptr_t)__src;
          if (uVar11 < 0xd) {
            struct_validitymask_locations[1]._4_4_ = 0;
            struct_validitymask_locations[0]._4_4_ = 0;
            struct_validitymask_locations[1]._0_4_ = 0;
            if (uVar11 == 0) {
              __src = (uint *)0x0;
            }
            else {
              switchD_016b45db::default
                        ((void *)((long)struct_validitymask_locations + 4),__src,uVar11);
              __src = (uint *)CONCAT44(struct_validitymask_locations[1]._4_4_,
                                       struct_validitymask_locations[1]._0_4_);
            }
          }
          else {
            struct_validitymask_locations[0]._4_4_ = *__src;
          }
          sVar13.value.pointer.ptr = (char *)pdVar9;
          sVar13.value._0_8_ = __src;
          struct_validitymask_locations[1] = (data_ptr_t)__src;
          sVar13 = StringVector::AddStringOrBlob
                             ((StringVector *)v,
                              (Vector *)
                              CONCAT44(struct_validitymask_locations[0]._4_4_,
                                       (uint)struct_validitymask_locations[0]),sVar13);
          *(long *)(pdVar3 + iVar12 * 0x10) = sVar13.value._0_8_;
          *(long *)(pdVar3 + iVar12 * 0x10 + 8) = sVar13.value._8_8_;
          key_locations[iVar10] = key_locations[iVar10] + uVar11;
          pdVar9 = pdVar3;
        }
      }
    }
    else if (PVar1 == UINT128) {
      iVar2 = *vcount;
      pdVar9 = v->data;
      for (iVar10 = 0; iVar2 != iVar10; iVar10 = iVar10 + 1) {
        iVar12 = iVar10;
        if (sel->sel_vector != (sel_t *)0x0) {
          iVar12 = (idx_t)sel->sel_vector[iVar10];
        }
        pdVar3 = key_locations[iVar10];
        uVar6 = *(undefined8 *)(pdVar3 + 8);
        *(undefined8 *)(pdVar9 + iVar12 * 0x10) = *(undefined8 *)pdVar3;
        *(undefined8 *)(pdVar9 + iVar12 * 0x10 + 8) = uVar6;
        key_locations[iVar10] = pdVar3 + 0x10;
      }
    }
    else {
      if (PVar1 != INT128) goto switchD_0167eef5_caseD_a;
      iVar2 = *vcount;
      pdVar9 = v->data;
      for (iVar10 = 0; iVar2 != iVar10; iVar10 = iVar10 + 1) {
        iVar12 = iVar10;
        if (sel->sel_vector != (sel_t *)0x0) {
          iVar12 = (idx_t)sel->sel_vector[iVar10];
        }
        pdVar3 = key_locations[iVar10];
        uVar6 = *(undefined8 *)(pdVar3 + 8);
        *(undefined8 *)(pdVar9 + iVar12 * 0x10) = *(undefined8 *)pdVar3;
        *(undefined8 *)(pdVar9 + iVar12 * 0x10 + 8) = uVar6;
        key_locations[iVar10] = pdVar3 + 0x10;
      }
    }
  }
  return;
}

Assistant:

void RowOperations::HeapGather(Vector &v, const idx_t &vcount, const SelectionVector &sel, data_ptr_t *key_locations,
                               optional_ptr<NestedValidity> parent_validity) {
	v.SetVectorType(VectorType::FLAT_VECTOR);

	auto &validity = FlatVector::Validity(v);
	if (parent_validity) {
		for (idx_t i = 0; i < vcount; i++) {
			const auto valid = parent_validity->IsValid(i);
			const auto col_idx = sel.get_index(i);
			validity.Set(col_idx, valid);
		}
	}

	auto type = v.GetType().InternalType();
	switch (type) {
	case PhysicalType::BOOL:
	case PhysicalType::INT8:
		TemplatedHeapGather<int8_t>(v, vcount, sel, key_locations);
		break;
	case PhysicalType::INT16:
		TemplatedHeapGather<int16_t>(v, vcount, sel, key_locations);
		break;
	case PhysicalType::INT32:
		TemplatedHeapGather<int32_t>(v, vcount, sel, key_locations);
		break;
	case PhysicalType::INT64:
		TemplatedHeapGather<int64_t>(v, vcount, sel, key_locations);
		break;
	case PhysicalType::UINT8:
		TemplatedHeapGather<uint8_t>(v, vcount, sel, key_locations);
		break;
	case PhysicalType::UINT16:
		TemplatedHeapGather<uint16_t>(v, vcount, sel, key_locations);
		break;
	case PhysicalType::UINT32:
		TemplatedHeapGather<uint32_t>(v, vcount, sel, key_locations);
		break;
	case PhysicalType::UINT64:
		TemplatedHeapGather<uint64_t>(v, vcount, sel, key_locations);
		break;
	case PhysicalType::INT128:
		TemplatedHeapGather<hugeint_t>(v, vcount, sel, key_locations);
		break;
	case PhysicalType::UINT128:
		TemplatedHeapGather<uhugeint_t>(v, vcount, sel, key_locations);
		break;
	case PhysicalType::FLOAT:
		TemplatedHeapGather<float>(v, vcount, sel, key_locations);
		break;
	case PhysicalType::DOUBLE:
		TemplatedHeapGather<double>(v, vcount, sel, key_locations);
		break;
	case PhysicalType::INTERVAL:
		TemplatedHeapGather<interval_t>(v, vcount, sel, key_locations);
		break;
	case PhysicalType::VARCHAR:
		HeapGatherStringVector(v, vcount, sel, key_locations);
		break;
	case PhysicalType::STRUCT:
		HeapGatherStructVector(v, vcount, sel, key_locations);
		break;
	case PhysicalType::LIST:
		HeapGatherListVector(v, vcount, sel, key_locations);
		break;
	case PhysicalType::ARRAY:
		HeapGatherArrayVector(v, vcount, sel, key_locations);
		break;
	default:
		throw NotImplementedException("Unimplemented deserialize from row-format");
	}
}